

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometryElement.cpp
# Opt level: O2

shared_ptr<iDynTree::XMLElement> __thiscall
iDynTree::GeometryElement::childElementForName(GeometryElement *this,string *name)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Any_data *this_00;
  shared_ptr<iDynTree::XMLElement> sVar3;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  this_00 = &local_98;
  __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             iDynTree::XMLElement::getParserState();
  std::make_shared<iDynTree::XMLElement,iDynTree::XMLParserState&,std::__cxx11::string_const&>
            ((XMLParserState *)this,__args_1);
  bVar1 = std::operator==(in_RDX,"box");
  if (bVar1) {
    this_00 = &local_38;
    local_38._8_8_ = 0;
    local_20 = std::
               _Function_handler<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/GeometryElement.cpp:26:43)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/GeometryElement.cpp:26:43)>
               ::_M_manager;
    local_38._M_unused._M_object = name;
    iDynTree::XMLElement::setAttributeCallback(*(undefined8 *)this,this_00);
  }
  else {
    bVar1 = std::operator==(in_RDX,"cylinder");
    if (bVar1) {
      this_00 = &local_58;
      local_58._8_8_ = 0;
      local_40 = std::
                 _Function_handler<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/GeometryElement.cpp:48:43)>
                 ::_M_invoke;
      local_48 = std::
                 _Function_handler<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/GeometryElement.cpp:48:43)>
                 ::_M_manager;
      local_58._M_unused._M_object = name;
      iDynTree::XMLElement::setAttributeCallback(*(undefined8 *)this,this_00);
    }
    else {
      bVar1 = std::operator==(in_RDX,"sphere");
      if (bVar1) {
        this_00 = &local_78;
        local_78._8_8_ = 0;
        local_60 = std::
                   _Function_handler<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/GeometryElement.cpp:78:43)>
                   ::_M_invoke;
        local_68 = std::
                   _Function_handler<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/GeometryElement.cpp:78:43)>
                   ::_M_manager;
        local_78._M_unused._M_object = name;
        iDynTree::XMLElement::setAttributeCallback(*(undefined8 *)this,this_00);
      }
      else {
        bVar1 = std::operator==(in_RDX,"mesh");
        _Var2._M_pi = extraout_RDX;
        if (!bVar1) goto LAB_00141115;
        local_98._8_8_ = 0;
        local_80 = std::
                   _Function_handler<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/GeometryElement.cpp:98:43)>
                   ::_M_invoke;
        local_88 = std::
                   _Function_handler<bool_(const_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::XMLAttribute>_>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/robotology[P]idyntree/src/model_io/codecs/src/GeometryElement.cpp:98:43)>
                   ::_M_manager;
        local_98._M_unused._M_object = name;
        iDynTree::XMLElement::setAttributeCallback(*(undefined8 *)this,&local_98);
      }
    }
  }
  std::_Function_base::~_Function_base((_Function_base *)this_00);
  _Var2._M_pi = extraout_RDX_00;
LAB_00141115:
  sVar3.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_XMLElement;
  return (shared_ptr<iDynTree::XMLElement>)
         sVar3.super___shared_ptr<iDynTree::XMLElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<iDynTree::XMLElement> GeometryElement::childElementForName(const std::string& name)
    {
        std::shared_ptr<XMLElement> element = std::make_shared<XMLElement>(
            getParserState(), name);
        if (name == "box") {
            element->setAttributeCallback([this](const std::unordered_map<std::string, std::shared_ptr<iDynTree::XMLAttribute>> &attributes){

                auto found = attributes.find("size");
                if (found == attributes.end()) {
                    reportError("GeometryElement", "childElementForName::box", "Missing 'size' attribute for box geometry.");
                    return false;
                }
                Vector3 boxDimensionn;
                if (!vector3FromString(found->second->value(), boxDimensionn)) {

                    return false;
                }
                Box *box = new Box();

                box->setX(boxDimensionn(0));
                box->setY(boxDimensionn(1));
                box->setZ(boxDimensionn(2));

                m_shape = std::shared_ptr<SolidShape>(box);
                return true;
            });
        } else if (name == "cylinder") {
            element->setAttributeCallback([this](const std::unordered_map<std::string, std::shared_ptr<iDynTree::XMLAttribute> > &attributes){

                double radius, length;
                auto found = attributes.find("radius");
                if (found == attributes.end()) {
                    reportError("GeometryElement", "childElementForName::cylinder", "Missing 'radius' attribute for cylinder geometry.");
                    return false;
                }
                if (!stringToDoubleWithClassicLocale(found->second->value(), radius)) {
                    reportError("GeometryElement", "childElementForName::cylinder", "Failed to parse 'radius' attribute for cylinder geometry.");
                    return false;
                }

                found = attributes.find("length");
                if (found == attributes.end()) {
                    reportError("GeometryElement", "childElementForName::cylinder", "Missing 'length' attribute for cylinder geometry.");
                    return false;
                }
                if (!stringToDoubleWithClassicLocale(found->second->value(), length)) {
                    reportError("GeometryElement", "childElementForName::cylinder", "Failed to parse 'length' attribute for cylinder geometry.");
                    return false;
                }
                Cylinder * cylinder = new Cylinder();
                cylinder->setRadius(radius);
                cylinder->setLength(length);

                m_shape = std::shared_ptr<Cylinder>(cylinder);
                return true;
            });
        } else if (name == "sphere") {
            element->setAttributeCallback([this](const std::unordered_map<std::string, std::shared_ptr<iDynTree::XMLAttribute> > &attributes){

                double radius;
                auto found = attributes.find("radius");
                if (found == attributes.end()) {
                    reportError("GeometryElement", "childElementForName::sphere", "Missing 'radius' attribute for sphere geometry.");
                    return false;
                }
                if (!stringToDoubleWithClassicLocale(found->second->value(), radius)) {
                    reportError("GeometryElement", "childElementForName::sphere", "Failed to parse 'radius' attribute for sphere geometry.");
                    return false;
                }

                Sphere * sphere = new Sphere();
                sphere->setRadius(radius);

                m_shape = std::shared_ptr<Sphere>(sphere);
                return true;
            });
        } else if (name == "mesh") {
            element->setAttributeCallback([this](const std::unordered_map<std::string, std::shared_ptr<iDynTree::XMLAttribute> > &attributes){

                auto found = attributes.find("filename");
                if (found == attributes.end()) {
                    reportWarning("GeometryElement", "childElementForName::mesh", "Missing 'filename' attribute for sphere mesh.");
                } else {
                    //TODO: Do not fail (?)
                    // For now we just support urdf with local meshes, see as an example
                    // https://github.com/bulletphysics/bullet3/tree/master/data
                    ExternalMesh * externalMesh = new ExternalMesh();
                    externalMesh->setFilename(found->second->value());
                    externalMesh->setPackageDirs(this->packageDirs);
                    //                    pExternalMesh->filename = getURDFMeshAbsolutePathFilename(urdf_filename,localName);
                    iDynTree::Vector3 scale;
                    scale(0) = scale(1) = scale(2) = 1.0;

                    found = attributes.find("scale");
                    if (found != attributes.end()) {
                        vector3FromString(found->second->value(), scale);
                    }
                    externalMesh->setScale(scale);
                    m_shape = std::shared_ptr<ExternalMesh>(externalMesh);
                }
                return true;
            });
        }
        return element;
    }